

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> * __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *this
          ,SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>
           *other)

{
  VariableID VVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  CombinedImageSamplerParameter *pCVar6;
  CombinedImageSamplerParameter *pCVar7;
  ulong local_28;
  size_t i;
  SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *other_local;
  SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->
                 super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                 ).buffer_size);
    for (local_28 = 0;
        local_28 <
        (other->super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>)
        .buffer_size; local_28 = local_28 + 1) {
      pCVar6 = (this->
               super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
               ptr + local_28;
      pCVar7 = (other->
               super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
               ptr + local_28;
      VVar1.id = (pCVar7->image_id).id;
      pCVar6->id = (VariableID)(pCVar7->id).id;
      pCVar6->image_id = (VariableID)VVar1.id;
      bVar2 = pCVar7->global_image;
      bVar3 = pCVar7->global_sampler;
      bVar4 = pCVar7->depth;
      uVar5 = pCVar7->field_0xf;
      pCVar6->sampler_id = (VariableID)(pCVar7->sampler_id).id;
      pCVar6->global_image = bVar2;
      pCVar6->global_sampler = bVar3;
      pCVar6->depth = bVar4;
      pCVar6->field_0xf = uVar5;
    }
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
    buffer_size = (other->
                  super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                  ).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}